

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint32_t sx_hash_u64_to_u32(uint64_t key)

{
  ulong uVar1;
  uint64_t key_local;
  
  uVar1 = (key ^ 0xffffffffffffffff) + key * 0x40000;
  uVar1 = (uVar1 ^ uVar1 >> 0x1f) * 0x15;
  uVar1 = (uVar1 ^ uVar1 >> 0xb) * 0x41;
  return (uint)uVar1 ^ (uint)(uVar1 >> 0x16);
}

Assistant:

SX_INLINE SX_CONSTEXPR uint32_t sx_hash_u64_to_u32(uint64_t key)
{
    key = (~key) + (key << 18);
    key = key ^ (key >> 31);
    key = key * 21;
    key = key ^ (key >> 11);
    key = key + (key << 6);
    key = key ^ (key >> 22);
    return (uint32_t)key;
}